

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Apu.cpp
# Opt level: O0

void __thiscall Hes_Osc::run_until(Hes_Osc *this,synth_t *synth_,blip_time_t end_time)

{
  Blip_Buffer *pBVar1;
  imp_t iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int in_EDX;
  Blip_Synth<8,_1> *in_RDI;
  blargg_long count;
  int delta_3;
  int new_dac_1;
  int period_1;
  int phase;
  int delta_2;
  int new_dac;
  uint noise_lfsr;
  int period;
  blip_time_t time;
  int delta_1;
  int volume_1;
  Blip_Buffer *osc_outputs_1;
  int delta;
  int volume_0;
  int dac;
  Blip_Buffer *osc_outputs_0;
  int in_stack_ffffffffffffff88;
  blip_time_t in_stack_ffffffffffffff8c;
  int local_5c;
  uint local_58;
  uint local_4c;
  int local_44;
  uint local_24;
  
  pBVar1 = *(Blip_Buffer **)(in_RDI->impulses + 0xc);
  if ((pBVar1 != (Blip_Buffer *)0x0) && ((in_RDI->impulses[0x22] & 0x80) != 0)) {
    local_24 = (uint)*(byte *)((long)in_RDI->impulses + 0xf);
    iVar3 = (int)(short)(in_RDI->impl).width;
    if (local_24 * iVar3 - (in_RDI->impl).kernel_unit != 0) {
      Blip_Synth<8,_1>::offset
                (in_RDI,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,(Blip_Buffer *)0x8206ff)
      ;
    }
    Blip_Buffer::set_modified(pBVar1);
    pBVar1 = *(Blip_Buffer **)(in_RDI->impulses + 0x10);
    iVar4 = (int)*(short *)((long)&(in_RDI->impl).width + 2);
    if (pBVar1 != (Blip_Buffer *)0x0) {
      if (local_24 * iVar4 - *(int *)in_RDI->impulses != 0) {
        Blip_Synth<8,_1>::offset
                  (in_RDI,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                   (Blip_Buffer *)0x82075e);
      }
      Blip_Buffer::set_modified(pBVar1);
    }
    local_44 = *(int *)(in_RDI->impulses + 8) + *(int *)(in_RDI->impulses + 2);
    if (local_44 < in_EDX) {
      if ((in_RDI->impulses[6] & 0x80) == 0) {
        if ((in_RDI->impulses[0x22] & 0x40) == 0) {
          local_58 = *(byte *)((long)in_RDI->impulses + 0xd) + 1 & 0x1f;
          local_5c = *(int *)(in_RDI->impulses + 4) * 2;
          if ((local_5c < 0xe) || (iVar3 == 0 && iVar4 == 0)) {
            if (local_5c == 0) {
              local_5c = 1;
            }
            iVar6 = ((in_EDX - local_44) + local_5c + -1) / local_5c;
            local_58 = iVar6 + local_58;
            local_44 = iVar6 * local_5c + local_44;
          }
          else {
            do {
              uVar5 = (uint)*(byte *)((long)in_RDI->impulses + (long)(int)local_58 + -0x28);
              local_58 = local_58 + 1 & 0x1f;
              if ((uVar5 != local_24) &&
                 (Blip_Synth<8,_1>::offset
                            (in_RDI,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                             (Blip_Buffer *)0x82092d), local_24 = uVar5,
                 pBVar1 != (Blip_Buffer *)0x0)) {
                Blip_Synth<8,_1>::offset
                          (in_RDI,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                           (Blip_Buffer *)0x820951);
              }
              local_44 = local_5c + local_44;
            } while (local_44 < in_EDX);
          }
          *(byte *)((long)in_RDI->impulses + 0xd) = (char)local_58 - 1U & 0x1f;
        }
      }
      else if (iVar3 != 0 || iVar4 != 0) {
        iVar2 = in_RDI->impulses[6];
        local_4c = *(uint *)(in_RDI->impulses + 0x20);
        do {
          uVar5 = -(local_4c >> 1 & 1) & 0x1f;
          local_4c = local_4c >> 1 ^ -(local_4c & 1) & 0xe008;
          if ((uVar5 != local_24) &&
             (Blip_Synth<8,_1>::offset
                        (in_RDI,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                         (Blip_Buffer *)0x820836), local_24 = uVar5, pBVar1 != (Blip_Buffer *)0x0))
          {
            Blip_Synth<8,_1>::offset
                      (in_RDI,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                       (Blip_Buffer *)0x82085a);
          }
          local_44 = (0x20 - ((byte)iVar2 & 0x1f)) * 0x40 + local_44;
        } while (local_44 < in_EDX);
        *(uint *)(in_RDI->impulses + 0x20) = local_4c;
      }
    }
    local_44 = local_44 - in_EDX;
    if (local_44 < 0) {
      local_44 = 0;
    }
    *(int *)(in_RDI->impulses + 2) = local_44;
    *(char *)((long)in_RDI->impulses + 0xf) = (char)local_24;
    (in_RDI->impl).kernel_unit = local_24 * iVar3;
    *(uint *)in_RDI->impulses = local_24 * iVar4;
  }
  *(int *)(in_RDI->impulses + 8) = in_EDX;
  return;
}

Assistant:

void Hes_Osc::run_until( synth_t& synth_, blip_time_t end_time )
{
	Blip_Buffer* const osc_outputs_0 = outputs [0]; // cache often-used values
	if ( osc_outputs_0 && control & 0x80 )
	{
		int dac = this->dac;
		
		int const volume_0 = volume [0];
		{
			int delta = dac * volume_0 - last_amp [0];
			if ( delta )
				synth_.offset( last_time, delta, osc_outputs_0 );
			osc_outputs_0->set_modified();
		}
		
		Blip_Buffer* const osc_outputs_1 = outputs [1];
		int const volume_1 = volume [1];
		if ( osc_outputs_1 )
		{
			int delta = dac * volume_1 - last_amp [1];
			if ( delta )
				synth_.offset( last_time, delta, osc_outputs_1 );
			osc_outputs_1->set_modified();
		}
		
		blip_time_t time = last_time + delay;
		if ( time < end_time )
		{
			if ( noise & 0x80 )
			{
				if ( volume_0 | volume_1 )
				{
					// noise
					int const period = (32 - (noise & 0x1F)) * 64; // TODO: correct?
					unsigned noise_lfsr = this->noise_lfsr;
					do
					{
						int new_dac = 0x1F & (unsigned)-(int)(noise_lfsr >> 1 & 1);
						// Implemented using "Galios configuration"
						// TODO: find correct LFSR algorithm
						noise_lfsr = (noise_lfsr >> 1) ^ (0xE008 & (unsigned)-(int)(noise_lfsr & 1));
						//noise_lfsr = (noise_lfsr >> 1) ^ (0x6000 & -(noise_lfsr & 1));
						int delta = new_dac - dac;
						if ( delta )
						{
							dac = new_dac;
							synth_.offset( time, delta * volume_0, osc_outputs_0 );
							if ( osc_outputs_1 )
								synth_.offset( time, delta * volume_1, osc_outputs_1 );
						}
						time += period;
					}
					while ( time < end_time );
					
					this->noise_lfsr = noise_lfsr;
					assert( noise_lfsr );
				}
			}
			else if ( !(control & 0x40) )
			{
				// wave
				int phase = (this->phase + 1) & 0x1F; // pre-advance for optimal inner loop
				int period = this->period * 2;
				if ( period >= 14 && (volume_0 | volume_1) )
				{
					do
					{
						int new_dac = wave [phase];
						phase = (phase + 1) & 0x1F;
						int delta = new_dac - dac;
						if ( delta )
						{
							dac = new_dac;
							synth_.offset( time, delta * volume_0, osc_outputs_0 );
							if ( osc_outputs_1 )
								synth_.offset( time, delta * volume_1, osc_outputs_1 );
						}
						time += period;
					}
					while ( time < end_time );
				}
				else
				{
					if ( !period )
					{
						// TODO: Gekisha Boy assumes that period = 0 silences wave
						//period = 0x1000 * 2;
						period = 1;
						//if ( !(volume_0 | volume_1) )
						//  debug_printf( "Used period 0\n" );
					}
					
					// maintain phase when silent
					blargg_long count = (end_time - time + period - 1) / period;
					phase += count; // phase will be masked below
					time += count * period;
				}
				this->phase = (phase - 1) & 0x1F; // undo pre-advance
			}
		}
		time -= end_time;
		if ( time < 0 )
			time = 0;
		delay = time;
		
		this->dac = dac;
		last_amp [0] = dac * volume_0;
		last_amp [1] = dac * volume_1;
	}
	last_time = end_time;
}